

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc)

{
  string loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38 [2];
  long local_28 [2];
  
  cmTarget::GetMacContentDirectory(__return_storage_ptr__,this->GT->Target,&this->ConfigName,false);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmsys::SystemTools::MakeDirectory((__return_storage_ptr__->_M_dataplus)._M_p);
  std::__cxx11::string::string((string *)&local_58,pkgloc,(allocator *)local_38);
  std::__cxx11::string::find((char)&local_58,0x2f);
  std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
  std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->MacContentFolders,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOSXBundleGenerator::InitMacOSXContentDirectory(const char* pkgloc)
{
  // Construct the full path to the content subdirectory.

  std::string macdir =
    this->GT->Target->GetMacContentDirectory(this->ConfigName,
                                         /*implib*/ false);
  macdir += "/";
  macdir += pkgloc;
  cmSystemTools::MakeDirectory(macdir.c_str());

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
  std::string loc = pkgloc;
  loc = loc.substr(0, loc.find('/'));
  this->MacContentFolders->insert(loc);
  }

  return macdir;
}